

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.c
# Opt level: O1

BOOL MemoryEqual(void *buffer1,void *buffer2,uint size)

{
  long lVar1;
  byte bVar2;
  BYTE *b2;
  BYTE *b1;
  
  if (size != 0) {
    lVar1 = 0;
    bVar2 = 0;
    do {
      bVar2 = bVar2 | *(byte *)((long)buffer2 + lVar1) ^ *(byte *)((long)buffer1 + lVar1);
      lVar1 = lVar1 + 1;
    } while (size != (uint)lVar1);
    return (uint)(bVar2 == 0);
  }
  return 1;
}

Assistant:

BOOL MemoryEqual(
    const void      *buffer1,       // IN: compare buffer1
    const void      *buffer2,       // IN: compare buffer2
    unsigned int     size           // IN: size of bytes being compared
    )
{
    BYTE         equal = 0;
    const BYTE  *b1 = (BYTE *)buffer1;
    const BYTE  *b2 = (BYTE *)buffer2;
//
    // Compare all bytes so that there is no leakage of information
    // due to timing differences.
    for(; size > 0; size--)
        equal |= (*b1++ ^ *b2++);
    return (equal == 0);
}